

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

void anon_unknown.dwarf_ae8::ndiPHINFHelper(ndicapi *pol,char *cp,char *crp)

{
  char cVar1;
  bool bVar2;
  byte bVar3;
  long lVar4;
  bool bVar5;
  int i;
  char *pcVar6;
  char cVar7;
  bool bVar8;
  
  if (cp[5] == ' ') {
    if (cp[6] != '\r') goto LAB_00108b23;
LAB_00108a87:
    cVar1 = *crp;
    pol->PhinfUnoccupied = (uint)(cVar1 == 'U') * 3;
    bVar3 = 0;
    if (cVar1 == 'U') goto LAB_00108aa3;
LAB_00108b99:
    lVar4 = 0;
    do {
      if (crp[lVar4] < ' ') break;
      pol->PhinfBasic[lVar4] = crp[lVar4];
      lVar4 = lVar4 + 1;
    } while ((int)lVar4 != 0x21);
    crp = crp + lVar4;
    bVar8 = false;
LAB_00108bbd:
    if ((bVar3 & 2) != 0) {
      if (!bVar8) {
        lVar4 = 0;
        do {
          if (crp[lVar4] < ' ') break;
          pol->PhinfTesting[lVar4] = crp[lVar4];
          lVar4 = lVar4 + 1;
        } while ((int)lVar4 != 8);
        crp = crp + lVar4;
        goto LAB_00108c01;
      }
      goto LAB_00108bf2;
    }
LAB_00108c01:
    if ((bVar3 & 4) != 0) {
      if (bVar8) goto LAB_00108c36;
      lVar4 = 0;
      do {
        if (crp[lVar4] < ' ') break;
        pol->PhinfPartNumber[lVar4] = crp[lVar4];
        lVar4 = lVar4 + 1;
      } while ((int)lVar4 != 0x14);
      crp = crp + lVar4;
    }
LAB_00108c49:
    if ((bVar3 & 8) != 0) {
      pcVar6 = pol->PhinfAccessories;
      if (bVar8) {
LAB_00108c58:
        pol->PhinfAccessories[0] = '0';
        pol->PhinfAccessories[1] = '0';
        bVar8 = true;
      }
      else {
        bVar5 = true;
        do {
          bVar2 = bVar5;
          cVar1 = *crp;
          if (cVar1 < ' ') break;
          crp = crp + 1;
          *pcVar6 = cVar1;
          pcVar6 = pcVar6 + 1;
          bVar5 = false;
        } while (bVar2);
      }
    }
    if ((bVar3 & 0x10) != 0) {
      pcVar6 = pol->PhinfMarkerType;
      if (bVar8) {
LAB_00108c91:
        pol->PhinfMarkerType[0] = '0';
        pol->PhinfMarkerType[1] = '0';
        bVar8 = true;
      }
      else {
        bVar5 = true;
        do {
          bVar2 = bVar5;
          cVar1 = *crp;
          if (cVar1 < ' ') break;
          crp = crp + 1;
          *pcVar6 = cVar1;
          pcVar6 = pcVar6 + 1;
          bVar5 = false;
        } while (bVar2);
      }
    }
    if ((bVar3 & 0x20) != 0) {
      if (bVar8) goto LAB_00108cca;
      lVar4 = 0;
      do {
        if (crp[lVar4] < ' ') break;
        pol->PhinfPortLocation[lVar4] = crp[lVar4];
        lVar4 = lVar4 + 1;
      } while ((int)lVar4 != 0xe);
      crp = crp + lVar4;
    }
  }
  else {
    if ((cp[5] != ':') || (cp[10] == '\r')) goto LAB_00108a87;
LAB_00108b23:
    lVar4 = 0;
    bVar3 = 0;
    do {
      cVar1 = cp[lVar4 + 8];
      cVar7 = -0x57;
      if (((5 < (byte)(cVar1 + 0x9fU)) && (cVar7 = -0x37, 5 < (byte)(cVar1 + 0xbfU))) &&
         (cVar7 = -0x30, 9 < (byte)(cVar1 - 0x30U))) break;
      bVar3 = bVar3 << 4 | cVar7 + cVar1;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    cVar1 = *crp;
    bVar8 = cVar1 == 'U';
    pol->PhinfUnoccupied = (uint)bVar8 * 3;
    if ((bVar3 & 1) == 0) goto LAB_00108bbd;
    if (cVar1 != 'U') goto LAB_00108b99;
LAB_00108aa3:
    builtin_strncpy(pol->PhinfBasic,"00000000            0000000000000",0x21);
    if ((bVar3 & 2) != 0) {
LAB_00108bf2:
      builtin_strncpy(pol->PhinfTesting,"00000000",8);
      bVar8 = true;
      goto LAB_00108c01;
    }
    if ((bVar3 & 4) != 0) {
LAB_00108c36:
      builtin_strncpy(pol->PhinfPartNumber,"                    ",0x14);
      bVar8 = true;
      goto LAB_00108c49;
    }
    if ((bVar3 & 8) != 0) goto LAB_00108c58;
    if ((bVar3 & 0x10) != 0) goto LAB_00108c91;
    if ((bVar3 & 0x20) == 0) {
      if ((bVar3 & 0x40) == 0) {
        return;
      }
      goto LAB_00108d0b;
    }
LAB_00108cca:
    builtin_strncpy(pol->PhinfPortLocation,"00000000000000",0xe);
    bVar8 = true;
  }
  if ((bVar3 & 0x40) == 0) {
    return;
  }
  if (!bVar8) {
    lVar4 = 0;
    bVar8 = true;
    do {
      bVar5 = bVar8;
      if (crp[lVar4] < ' ') {
        return;
      }
      pol->PhinfGpioStatus[lVar4] = crp[lVar4];
      lVar4 = lVar4 + 1;
      bVar8 = false;
    } while (bVar5);
    return;
  }
LAB_00108d0b:
  pol->PhinfGpioStatus[0] = '0';
  pol->PhinfGpioStatus[1] = '0';
  return;
}

Assistant:

void ndiPHINFHelper(ndicapi* pol, const char* cp, const char* crp)
  {
    unsigned long mode = 0x0001; // the default reply mode
    char* dp;
    int j;
    int unoccupied = NDI_OKAY;

    // if the PHINF command had a reply mode, read it
    if ((cp[5] == ':' && cp[10] != '\r') || (cp[5] == ' ' && cp[6] != '\r'))
    {
      mode = ndiHexToUnsignedLong(&cp[8], 4);
    }

    // check for unoccupied
    if (*crp == 'U')
    {
      unoccupied = NDI_UNOCCUPIED;
    }
    pol->PhinfUnoccupied = unoccupied;

    // fprintf(stderr, "mode = %04lx\n", mode);

    if (mode & NDI_BASIC)
    {
      dp = pol->PhinfBasic;
      if (!unoccupied)
      {
        for (j = 0; j < 33 && *crp >= ' '; j++)
        {
          // fprintf(stderr,"%c",*crp);
          *dp++ = *crp++;
        }
        // fprintf(stderr,"\n");
      }
      else    // default "00000000            0000000000000"
      {
        for (j = 0; j < 8; j++)
        {
          *dp++ = '0';
        }
        for (j = 0; j < 12; j++)
        {
          *dp++ = ' ';
        }
        for (j = 0; j < 13; j++)
        {
          *dp++ = '0';
        }
      }
    }

    if (mode & NDI_TESTING)
    {
      dp = pol->PhinfTesting;
      if (!unoccupied)
      {
        for (j = 0; j < 8 && *crp >= ' '; j++)
        {
          *dp++ = *crp++;
        }
      }
      else   // default "00000000"
      {
        for (j = 0; j < 8; j++)
        {
          *dp++ = '0';
        }
      }
    }

    if (mode & NDI_PART_NUMBER)
    {
      dp = pol->PhinfPartNumber;
      if (!unoccupied)
      {
        for (j = 0; j < 20 && *crp >= ' '; j++)
        {
          *dp++ = *crp++;
        }
      }
      else   // default "                    "
      {
        for (j = 0; j < 20; j++)
        {
          *dp++ = ' ';
        }
      }
    }

    if (mode & NDI_ACCESSORIES)
    {
      dp = pol->PhinfAccessories;
      if (!unoccupied)
      {
        for (j = 0; j < 2 && *crp >= ' '; j++)
        {
          *dp++ = *crp++;
        }
      }
      else   // default "00"
      {
        for (j = 0; j < 2; j++)
        {
          *dp++ = '0';
        }
      }
    }

    if (mode & NDI_MARKER_TYPE)
    {
      dp = pol->PhinfMarkerType;
      if (!unoccupied)
      {
        for (j = 0; j < 2 && *crp >= ' '; j++)
        {
          *dp++ = *crp++;
        }
      }
      else   // default "00"
      {
        for (j = 0; j < 2; j++)
        {
          *dp++ = '0';
        }
      }
    }

    if (mode & NDI_PORT_LOCATION)
    {
      dp = pol->PhinfPortLocation;
      if (!unoccupied)
      {
        for (j = 0; j < 14 && *crp >= ' '; j++)
        {
          *dp++ = *crp++;
        }
      }
      else   // default "00000000000000"
      {
        for (j = 0; j < 14; j++)
        {
          *dp++ = '0';
        }
      }
    }

    if (mode & NDI_GPIO_STATUS)
    {
      dp = pol->PhinfGpioStatus;
      if (!unoccupied)
      {
        for (j = 0; j < 2 && *crp >= ' '; j++)
        {
          *dp++ = *crp++;
        }
      }
      else   // default "00"
      {
        for (j = 0; j < 2; j++)
        {
          *dp++ = '0';
        }
      }
    }
  }